

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::FillPatchIterator::FillFromTwoLevels
          (FillPatchIterator *this,Real time,int idx,int scomp,int dcomp,int ncomp)

{
  long lVar1;
  AmrLevel *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> geom_;
  undefined8 sd;
  StateData *sd_00;
  StateDescriptor *this_01;
  int in_EDX;
  long in_RDI;
  StateDescriptor *desc;
  StateDataPhysBCFunct physbcf_fine;
  StateData *statedata_fine;
  Vector<double,_std::allocator<double>_> stime_fine;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> smf_fine;
  StateDataPhysBCFunct physbcf_crse;
  StateData *statedata_crse;
  Vector<double,_std::allocator<double>_> stime_crse;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> smf_crse;
  Geometry *geom_crse;
  Geometry *geom_fine;
  AmrLevel *crse_level;
  AmrLevel *fine_level;
  int ilev_crse;
  int ilev_fine;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined8 in_stack_fffffffffffffe08;
  int i;
  StateDescriptor *in_stack_fffffffffffffe10;
  Real in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffeb0;
  StateData *in_stack_fffffffffffffeb8;
  StateData *this_02;
  int scomp_00;
  Vector<double,_std::allocator<double>_> *ft;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffee0;
  StateData *in_stack_fffffffffffffef0;
  Real in_stack_fffffffffffffef8;
  Geometry *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  Geometry *in_stack_ffffffffffffff50;
  Geometry *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 cbccomp;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  Geometry *geom__00;
  
  i = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  lVar1 = *(long *)(in_RDI + 0x60);
  this_00 = Amr::getLevel((Amr *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          in_stack_fffffffffffffdfc);
  geom_._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 0x10);
  geom__00 = &this_00->geom;
  scomp_00 = (int)((ulong)&stack0xffffffffffffff88 >> 0x20);
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x139a0af);
  ft = (Vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff70;
  Vector<double,_std::allocator<double>_>::Vector
            ((Vector<double,_std::allocator<double>_> *)0x139a0c4);
  sd = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                 ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                  CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                  CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  StateData::getData(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                     (Vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     in_stack_fffffffffffffea0);
  StateDataPhysBCFunct::StateDataPhysBCFunct
            ((StateDataPhysBCFunct *)&stack0xffffffffffffff40,(StateData *)sd,in_EDX,geom__00);
  cbccomp = (undefined4)sd;
  this_02 = (StateData *)&stack0xffffffffffffff28;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x139a14b);
  Vector<double,_std::allocator<double>_>::Vector
            ((Vector<double,_std::allocator<double>_> *)0x139a160);
  sd_00 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                    ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  StateData::getData(this_02,in_stack_fffffffffffffeb0,
                     (Vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     in_stack_fffffffffffffea0);
  StateDataPhysBCFunct::StateDataPhysBCFunct
            ((StateDataPhysBCFunct *)&stack0xfffffffffffffef0,sd_00,in_EDX,(Geometry *)geom_._M_pi);
  this_01 = DescriptorList::operator[]
                      ((DescriptorList *)
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       in_stack_fffffffffffffdfc);
  AmrLevel::fineRatio(this_00);
  StateDescriptor::interp(in_stack_fffffffffffffe10,i);
  StateDescriptor::getBCs(this_01);
  FillPatchTwoLevels<amrex::MultiFab,amrex::StateDataPhysBCFunct,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
            ((MultiFab *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffffef0,(Vector<double,_std::allocator<double>_> *)this_01,
             in_stack_fffffffffffffee0,ft,scomp_00,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
             (StateDataPhysBCFunct *)in_stack_ffffffffffffff60,cbccomp,
             (StateDataPhysBCFunct *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
             (IntVect *)in_stack_ffffffffffffff80,(InterpBase *)in_stack_ffffffffffffff88,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff98,(NullInterpHook<amrex::FArrayBox> *)geom__00,
             (NullInterpHook<amrex::FArrayBox> *)geom_._M_pi);
  Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0x139a37e);
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x139a38b);
  Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0x139a398);
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x139a3a5);
  return;
}

Assistant:

void
FillPatchIterator::FillFromTwoLevels (Real time, int idx, int scomp, int dcomp, int ncomp)
{
    int ilev_fine = m_amrlevel.level;
    int ilev_crse = ilev_fine-1;

    BL_ASSERT(ilev_crse >= 0);

    AmrLevel& fine_level = m_amrlevel;
    AmrLevel& crse_level = m_amrlevel.parent->getLevel(ilev_crse);

    const Geometry& geom_fine = fine_level.geom;
    const Geometry& geom_crse = crse_level.geom;

    Vector<MultiFab*> smf_crse;
    Vector<Real> stime_crse;
    StateData& statedata_crse = crse_level.state[idx];
    statedata_crse.getData(smf_crse,stime_crse,time);
    StateDataPhysBCFunct physbcf_crse(statedata_crse,scomp,geom_crse);

    Vector<MultiFab*> smf_fine;
    Vector<Real> stime_fine;
    StateData& statedata_fine = fine_level.state[idx];
    statedata_fine.getData(smf_fine,stime_fine,time);
    StateDataPhysBCFunct physbcf_fine(statedata_fine,scomp,geom_fine);

    const StateDescriptor& desc = AmrLevel::desc_lst[idx];

    amrex::FillPatchTwoLevels(m_fabs, time,
                              smf_crse, stime_crse,
                              smf_fine, stime_fine,
                              scomp, dcomp, ncomp,
                              geom_crse, geom_fine,
                              physbcf_crse, scomp,
                              physbcf_fine, scomp,
                              crse_level.fineRatio(),
                              desc.interp(scomp),
                              desc.getBCs(),scomp);
}